

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O0

void duckdb::CeilDecimalOperator::Operation<duckdb::hugeint_t,duckdb::Hugeint>
               (DataChunk *input,uint8_t scale,Vector *result)

{
  reference result_00;
  Vector *in_RDX;
  byte in_SIL;
  DataChunk *in_RDI;
  hugeint_t in;
  hugeint_t power_of_ten;
  idx_t in_stack_ffffffffffffffa8;
  vector<duckdb::Vector,_true> *in_stack_ffffffffffffffb0;
  hugeint_t local_28;
  Vector *local_18;
  DataChunk *local_8;
  
  in.upper = (int64_t)in_RDX;
  in.lower = *(uint64_t *)(duckdb::Value::DoubleIsFinite + (ulong)in_SIL * 0x10);
  local_18 = in_RDX;
  local_8 = in_RDI;
  local_28 = UnsafeNumericCast<duckdb::hugeint_t,duckdb::hugeint_t,void>
                       ((duckdb *)(&Hugeint::POWERS_OF_TEN)[(ulong)in_SIL * 2],in);
  result_00 = vector<duckdb::Vector,_true>::operator[]
                        (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  DataChunk::size(local_8);
  UnaryExecutor::
  Execute<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::CeilDecimalOperator::Operation<duckdb::hugeint_t,duckdb::Hugeint>(duckdb::DataChunk&,unsigned_char,duckdb::Vector&)::_lambda(duckdb::hugeint_t)_1_>
            (local_18,result_00,in_stack_ffffffffffffffa8,&local_28,CANNOT_ERROR);
  return;
}

Assistant:

static void Operation(DataChunk &input, uint8_t scale, Vector &result) {
		T power_of_ten = UnsafeNumericCast<T>(POWERS_OF_TEN_CLASS::POWERS_OF_TEN[scale]);
		UnaryExecutor::Execute<T, T>(input.data[0], result, input.size(), [&](T input) {
			if (input <= 0) {
				// below 0 we floor the number (e.g. -10.5 -> -10)
				return UnsafeNumericCast<T>(input / power_of_ten);
			} else {
				// above 0 we ceil the number
				return UnsafeNumericCast<T>(((input - 1) / power_of_ten) + 1);
			}
		});
	}